

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  int iVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  undefined1 uVar3;
  string se;
  openmode openmodeApp;
  ostringstream e;
  
  if (this->AppendMode == true) {
    openmodeApp = _S_app;
    se._M_dataplus._M_p = (this->MainImportFile)._M_dataplus._M_p;
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode&>
              ((char **)&e,(_Ios_Openmode *)&se);
    this_00 = _e;
    if (_e != (cmGeneratedFileStream *)0x0) goto LAB_001fd350;
    this_00 = (cmGeneratedFileStream *)0x0;
  }
  else {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->MainImportFile,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
LAB_001fd350:
    if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      (*this->_vptr_cmExportFileGenerator[2])(this,this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&e,"",(allocator<char> *)&se);
      (*this->_vptr_cmExportFileGenerator[4])(this,this_00,&e);
      std::__cxx11::string::~string((string *)&e);
      iVar1 = (*this->_vptr_cmExportFileGenerator[0xc])(this,this_00);
      uVar3 = (undefined1)iVar1;
      (*this->_vptr_cmExportFileGenerator[5])(this,this_00);
      (*this->_vptr_cmExportFileGenerator[3])(this,this_00);
      goto LAB_001fd455;
    }
  }
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->MainImportFile);
  poVar2 = std::operator<<(poVar2,"\": ");
  std::operator<<(poVar2,(string *)&se);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error((string *)&openmodeApp);
  std::__cxx11::string::~string((string *)&openmodeApp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  std::__cxx11::string::~string((string *)&se);
  uVar3 = 0;
  if (this_00 == (cmGeneratedFileStream *)0x0) {
    return false;
  }
LAB_001fd455:
  (*(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_00);
  return (bool)uVar3;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(this->MainImportFile.c_str(),
                                               openmodeApp);
  } else {
    // Generate atomically and with copy-if-different.
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  if (!foutPtr || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = *foutPtr;

  // Start with the import file header.
  this->GeneratePolicyHeaderCode(os);
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  this->GeneratePolicyFooterCode(os);

  return result;
}